

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

ErrorStackOption * __thiscall
ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::from_json
          (ErrorStackOption *__return_storage_ptr__,
          json_value_impl<ritobin::Map,_(ritobin::Category)7> *this,Map *value,json *json)

{
  bool bVar1;
  const_reference pvVar2;
  reference value_00;
  ErrorStack *this_00;
  json_value *this_01;
  size_t index_00;
  string_view type_name;
  string_view type_name_00;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  byte local_331;
  Value local_330;
  Value local_2e8;
  reference local_2a0;
  value_type *value_item;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *json_item;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  size_t index;
  value_type *json_items;
  char *local_230;
  string asStack_228 [32];
  __sv_type local_208;
  uint local_1f4;
  undefined1 local_1f0 [48];
  __sv_type local_1c0;
  undefined1 local_1b0 [8];
  string valueType_name;
  string keyType_name;
  undefined1 local_140 [48];
  undefined1 local_110 [48];
  undefined1 local_e0 [48];
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  Map *local_20;
  json *json_local;
  Map *value_local;
  ErrorStackOption *error;
  
  local_20 = value;
  json_local = (json *)this;
  value_local = (Map *)__return_storage_ptr__;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_object((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)value);
  if (bVar1) {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[10],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_20,(char (*) [10])"valueType");
    if (bVar1) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[8],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_20,(char (*) [8])"keyType");
      if (bVar1) {
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::contains<const_char_(&)[6],_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_20,(char (*) [6])"items");
        if (bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_20,"valueType");
          bVar1 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::is_string(pvVar2);
          if (bVar1) {
            pvVar2 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)local_20,"keyType");
            bVar1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::is_string(pvVar2);
            if (bVar1) {
              pvVar2 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)local_20,"items");
              bVar1 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::is_array(pvVar2);
              if (bVar1) {
                pvVar2 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)local_20,"keyType");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&valueType_name.field_2 + 8),pvVar2);
                pvVar2 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)local_20,"valueType");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0,pvVar2);
                local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)(valueType_name.field_2._M_local_buf + 8));
                type_name._M_str = (char *)json_local;
                type_name._M_len = (size_t)local_1c0._M_str;
                bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                        ::try_type_name_to_type
                                  ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                    *)local_1c0._M_len,type_name,&json->m_type);
                if (bVar1) {
                  local_208 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)local_1b0);
                  type_name_00._M_str = &json_local->field_0x1;
                  type_name_00._M_len = (size_t)local_208._M_str;
                  bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                          ::try_type_name_to_type
                                    ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                      *)local_208._M_len,type_name_00,&json->m_type);
                  if (bVar1) {
                    pvVar2 = nlohmann::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                         *)local_20,"items");
                    __range3 = (value_type *)0x0;
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::begin((const_iterator *)&__end3.m_it.primitive_iterator,pvVar2);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::end((const_iterator *)&json_item,pvVar2);
                    while (bVar1 = nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 *)&__end3.m_it.primitive_iterator,
                                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 *)&json_item), bVar1) {
                      value_item = (value_type *)
                                   nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                *)&__end3.m_it.primitive_iterator);
                      this_01 = &json_local->m_value;
                      ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                      ::type_to_value(&local_2e8,json_local->m_type);
                      ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                      ::type_to_value(&local_330,json_local->field_0x1);
                      value_00 = std::vector<ritobin::Pair,std::allocator<ritobin::Pair>>::
                                 emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                           ((vector<ritobin::Pair,std::allocator<ritobin::Pair>> *)
                                            &this_01->boolean,&local_2e8,&local_330);
                      std::
                      variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                      ::~variant(&local_330);
                      std::
                      variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                      ::~variant(&local_2e8);
                      local_331 = 0;
                      local_2a0 = value_00;
                      item_from_json(__return_storage_ptr__,value_00,(json *)value_item);
                      bVar1 = std::optional::operator_cast_to_bool
                                        ((optional *)__return_storage_ptr__);
                      if (bVar1) {
                        this_00 = std::optional<ritobin::io::json_impl::ErrorStack>::operator->
                                            (__return_storage_ptr__);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_398,"items",&local_399);
                        to_index(&local_378,&local_398);
                        to_index_abi_cxx11_(&local_3c0,(json_impl *)__range3,index_00);
                        std::operator+(&local_358,&local_378,&local_3c0);
                        ErrorStack::push(this_00,&local_358);
                        std::__cxx11::string::~string((string *)&local_358);
                        std::__cxx11::string::~string((string *)&local_3c0);
                        std::__cxx11::string::~string((string *)&local_378);
                        std::__cxx11::string::~string((string *)&local_398);
                        std::allocator<char>::~allocator(&local_399);
                        local_331 = 1;
                      }
                      local_1f4 = (uint)bVar1;
                      if ((local_331 & 1) == 0) {
                        std::optional<ritobin::io::json_impl::ErrorStack>::~optional
                                  (__return_storage_ptr__);
                      }
                      if (local_1f4 != 0) goto LAB_0017b053;
                      __range3 = (value_type *)&__range3->field_0x1;
                      nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&__end3.m_it.primitive_iterator);
                    }
                    std::optional<ritobin::io::json_impl::ErrorStack>::optional
                              (__return_storage_ptr__);
                    local_1f4 = 1;
                  }
                  else {
                    json_items = (value_type *)Map::type_name;
                    local_230 = 
                    "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
                    std::__cxx11::string::string(asStack_228);
                    std::optional<ritobin::io::json_impl::ErrorStack>::
                    optional<ritobin::io::json_impl::ErrorStack,_true>
                              (__return_storage_ptr__,(ErrorStack *)&json_items);
                    ErrorStack::~ErrorStack((ErrorStack *)&json_items);
                    local_1f4 = 1;
                  }
                }
                else {
                  local_1f0._0_8_ = "map";
                  local_1f0._8_8_ =
                       "ValueHelper::try_type_name_to_type(keyType_name, value.keyType)";
                  std::__cxx11::string::string((string *)(local_1f0 + 0x10));
                  std::optional<ritobin::io::json_impl::ErrorStack>::
                  optional<ritobin::io::json_impl::ErrorStack,_true>
                            (__return_storage_ptr__,(ErrorStack *)local_1f0);
                  ErrorStack::~ErrorStack((ErrorStack *)local_1f0);
                  local_1f4 = 1;
                }
LAB_0017b053:
                std::__cxx11::string::~string((string *)local_1b0);
                std::__cxx11::string::~string((string *)(valueType_name.field_2._M_local_buf + 8));
              }
              else {
                keyType_name.field_2._8_8_ = Map::type_name;
                std::__cxx11::string::string((string *)&stack0xfffffffffffffea0);
                std::optional<ritobin::io::json_impl::ErrorStack>::
                optional<ritobin::io::json_impl::ErrorStack,_true>
                          (__return_storage_ptr__,(ErrorStack *)((long)&keyType_name.field_2 + 8));
                ErrorStack::~ErrorStack((ErrorStack *)((long)&keyType_name.field_2 + 8));
              }
            }
            else {
              local_140._0_8_ = "map";
              local_140._8_8_ = "json[\"keyType\"].is_string()";
              std::__cxx11::string::string((string *)(local_140 + 0x10));
              std::optional<ritobin::io::json_impl::ErrorStack>::
              optional<ritobin::io::json_impl::ErrorStack,_true>
                        (__return_storage_ptr__,(ErrorStack *)local_140);
              ErrorStack::~ErrorStack((ErrorStack *)local_140);
            }
          }
          else {
            local_110._0_8_ = "map";
            local_110._8_8_ = "json[\"valueType\"].is_string()";
            std::__cxx11::string::string((string *)(local_110 + 0x10));
            std::optional<ritobin::io::json_impl::ErrorStack>::
            optional<ritobin::io::json_impl::ErrorStack,_true>
                      (__return_storage_ptr__,(ErrorStack *)local_110);
            ErrorStack::~ErrorStack((ErrorStack *)local_110);
          }
        }
        else {
          local_e0._0_8_ = "map";
          local_e0._8_8_ = "json.contains(\"items\")";
          std::__cxx11::string::string((string *)(local_e0 + 0x10));
          std::optional<ritobin::io::json_impl::ErrorStack>::
          optional<ritobin::io::json_impl::ErrorStack,_true>
                    (__return_storage_ptr__,(ErrorStack *)local_e0);
          ErrorStack::~ErrorStack((ErrorStack *)local_e0);
        }
      }
      else {
        local_b0._0_8_ = "map";
        local_b0._8_8_ = "json.contains(\"keyType\")";
        std::__cxx11::string::string((string *)(local_b0 + 0x10));
        std::optional<ritobin::io::json_impl::ErrorStack>::
        optional<ritobin::io::json_impl::ErrorStack,_true>
                  (__return_storage_ptr__,(ErrorStack *)local_b0);
        ErrorStack::~ErrorStack((ErrorStack *)local_b0);
      }
    }
    else {
      local_80._0_8_ = "map";
      local_80._8_8_ = "json.contains(\"valueType\")";
      std::__cxx11::string::string((string *)(local_80 + 0x10));
      std::optional<ritobin::io::json_impl::ErrorStack>::
      optional<ritobin::io::json_impl::ErrorStack,_true>
                (__return_storage_ptr__,(ErrorStack *)local_80);
      ErrorStack::~ErrorStack((ErrorStack *)local_80);
    }
  }
  else {
    local_50._0_8_ = "map";
    local_50._8_8_ = "json.is_object()";
    std::__cxx11::string::string((string *)(local_50 + 0x10));
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_50);
    ErrorStack::~ErrorStack((ErrorStack *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("keyType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["keyType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string keyType_name = json["keyType"];
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(keyType_name, value.keyType));
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.keyType),
                                                            ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }